

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O3

string * __thiscall
TokenScanner::scanString_abi_cxx11_(string *__return_storage_ptr__,TokenScanner *this)

{
  char cVar1;
  int iVar2;
  byte bVar3;
  string token;
  long *local_70;
  long local_68;
  long local_60 [2];
  string local_50;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  cVar1 = std::istream::get();
  std::__cxx11::string::push_back((char)&local_70);
  bVar3 = 0;
  while( true ) {
    iVar2 = std::istream::get();
    if (iVar2 == -1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"TokenScanner found unterminated string","");
      error(&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (!(bool)(iVar2 != cVar1 | bVar3)) break;
    std::__cxx11::string::push_back((char)&local_70);
    bVar3 = (bVar3 ^ 1) & iVar2 == 0x5c;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_70,local_68 + (long)local_70);
  std::__cxx11::string::_M_replace_aux
            ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

string TokenScanner::scanString() {
   string token = "";
   char delim = isp->get();
   token += delim;
   bool escape = false;
   while (true) {
      int ch = isp->get();
      if (ch == EOF) error("TokenScanner found unterminated string");
      if (ch == delim && !escape) break;
      escape = (ch == '\\') && !escape;
      token += ch;
   }
   return token + delim;
}